

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PSEngine.cpp
# Opt level: O1

void __thiscall PSEngine::print_subturns_history(PSEngine *this)

{
  AbsoluteDirection AVar1;
  ObjectDeltaType p_enum_value;
  element_type *peVar2;
  pointer pcVar3;
  pointer pPVar4;
  element_type *peVar5;
  bool bVar6;
  uint uVar7;
  uint uVar8;
  char cVar9;
  uint uVar10;
  long *plVar11;
  undefined8 *puVar12;
  ulong uVar13;
  ulong *puVar14;
  ulong uVar15;
  long *plVar16;
  pointer pRVar17;
  size_type *psVar18;
  ulong uVar19;
  pointer pRVar20;
  uint uVar21;
  pointer pMVar22;
  char cVar23;
  undefined8 uVar24;
  PatternMatchInformation *m;
  pointer pPVar25;
  uint uVar26;
  pointer pSVar27;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar28;
  string rule_match_str;
  string __str_2;
  string __str;
  string __str_1;
  string __str_7;
  string result;
  uint __uval;
  long *local_240;
  long local_238;
  long local_230;
  long lStack_228;
  char local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  ulong *local_1b8;
  long local_1b0;
  ulong local_1a8;
  long lStack_1a0;
  ulong *local_198;
  uint local_190;
  undefined4 uStack_18c;
  ulong local_188 [2];
  ulong *local_178;
  long local_170;
  ulong local_168 [2];
  long *local_158;
  long local_150;
  long local_148 [2];
  PSEngine *local_138;
  ulong local_130;
  pointer local_128;
  pointer local_120;
  pointer local_118;
  pointer local_110;
  pointer local_108;
  long *local_100 [2];
  long local_f0 [2];
  long *local_e0 [2];
  long local_d0 [2];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>_>_>
  local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
  local_60;
  
  local_158 = local_148;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
  pSVar27 = (this->m_turn_history).subturns.
            super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_138 = this;
  if ((this->m_turn_history).subturns.
      super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>.
      _M_impl.super__Vector_impl_data._M_finish != pSVar27) {
    uVar19 = 0;
    do {
      local_130 = uVar19 + 1;
      uVar21 = 1;
      if (8 < uVar19) {
        uVar13 = local_130;
        uVar7 = 4;
        do {
          uVar21 = uVar7;
          uVar26 = (uint)uVar13;
          if (uVar26 < 100) {
            uVar21 = uVar21 - 2;
            goto LAB_0011161e;
          }
          if (uVar26 < 1000) {
            uVar21 = uVar21 - 1;
            goto LAB_0011161e;
          }
          if (uVar26 < 10000) goto LAB_0011161e;
          uVar13 = (uVar13 & 0xffffffff) / 10000;
          uVar7 = uVar21 + 4;
        } while (99999 < uVar26);
        uVar21 = uVar21 + 1;
      }
LAB_0011161e:
      local_1b8 = &local_1a8;
      std::__cxx11::string::_M_construct((ulong)&local_1b8,(char)uVar21);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_1b8,uVar21,(uint)local_130);
      plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_1b8,0,(char *)0x0,0x14d1b3);
      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
      puVar14 = (ulong *)(plVar11 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar11 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_1d8.field_2._M_allocated_capacity = *puVar14;
        local_1d8.field_2._8_8_ = plVar11[3];
      }
      else {
        local_1d8.field_2._M_allocated_capacity = *puVar14;
        local_1d8._M_dataplus._M_p = (pointer)*plVar11;
      }
      local_1d8._M_string_length = plVar11[1];
      *plVar11 = (long)puVar14;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d8);
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      puVar14 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar14) {
        local_218.field_2._M_allocated_capacity = *puVar14;
        local_218.field_2._8_8_ = puVar12[3];
      }
      else {
        local_218.field_2._M_allocated_capacity = *puVar14;
        local_218._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_218._M_string_length = puVar12[1];
      *puVar12 = puVar14;
      puVar12[1] = 0;
      *(undefined1 *)(puVar12 + 2) = 0;
      uVar13 = ((long)(local_138->m_turn_history).subturns.
                      super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_138->m_turn_history).subturns.
                      super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      cVar23 = '\x01';
      if (9 < uVar13) {
        uVar15 = uVar13;
        cVar9 = '\x04';
        do {
          cVar23 = cVar9;
          if (uVar15 < 100) {
            cVar23 = cVar23 + -2;
            goto LAB_00111792;
          }
          if (uVar15 < 1000) {
            cVar23 = cVar23 + -1;
            goto LAB_00111792;
          }
          if (uVar15 < 10000) goto LAB_00111792;
          bVar6 = 99999 < uVar15;
          uVar15 = uVar15 / 10000;
          cVar9 = cVar23 + '\x04';
        } while (bVar6);
        cVar23 = cVar23 + '\x01';
      }
LAB_00111792:
      local_198 = local_188;
      std::__cxx11::string::_M_construct((ulong)&local_198,cVar23);
      std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_198,local_190,uVar13);
      uVar24 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        uVar24 = local_218.field_2._M_allocated_capacity;
      }
      uVar13 = CONCAT44(uStack_18c,local_190) + local_218._M_string_length;
      if ((ulong)uVar24 < uVar13) {
        uVar15 = 0xf;
        if (local_198 != local_188) {
          uVar15 = local_188[0];
        }
        if (uVar15 < uVar13) goto LAB_0011181d;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_198,0,(char *)0x0,(ulong)local_218._M_dataplus._M_p);
      }
      else {
LAB_0011181d:
        puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_198)
        ;
      }
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      psVar18 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar18) {
        local_1f8.field_2._M_allocated_capacity = *psVar18;
        local_1f8.field_2._8_8_ = puVar12[3];
      }
      else {
        local_1f8.field_2._M_allocated_capacity = *psVar18;
        local_1f8._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_1f8._M_string_length = puVar12[1];
      *puVar12 = psVar18;
      puVar12[1] = 0;
      *(undefined1 *)psVar18 = 0;
      plVar11 = (long *)std::__cxx11::string::append((char *)&local_1f8);
      local_240 = &local_230;
      plVar16 = plVar11 + 2;
      if ((long *)*plVar11 == plVar16) {
        local_230 = *plVar16;
        lStack_228 = plVar11[3];
      }
      else {
        local_230 = *plVar16;
        local_240 = (long *)*plVar11;
      }
      local_238 = plVar11[1];
      *plVar11 = (long)plVar16;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_240);
      if (local_240 != &local_230) {
        operator_delete(local_240,local_230 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      if (local_198 != local_188) {
        operator_delete(local_198,local_188[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
        operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
      }
      if (local_1b8 != &local_1a8) {
        operator_delete(local_1b8,local_1a8 + 1);
      }
      pRVar17 = pSVar27[uVar19].steps.
                super__Vector_base<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_110 = pSVar27[uVar19].steps.
                  super__Vector_base<PSEngine::RuleDelta,_std::allocator<PSEngine::RuleDelta>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      if (pRVar17 != local_110) {
        do {
          local_128 = pRVar17;
          if (pRVar17->is_movement_resolution == true) {
            std::__cxx11::string::append((char *)&local_158);
            pMVar22 = (local_128->movement_deltas).
                      super__Vector_base<PSEngine::MovementDelta,_std::allocator<PSEngine::MovementDelta>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_118 = (local_128->movement_deltas).
                        super__Vector_base<PSEngine::MovementDelta,_std::allocator<PSEngine::MovementDelta>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            if (pMVar22 != local_118) {
              do {
                paVar28 = &local_1f8.field_2;
                std::__cxx11::string::append((char *)&local_158);
                peVar2 = (pMVar22->object).
                         super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr;
                local_1f8._M_dataplus._M_p = (pointer)paVar28;
                if (peVar2 == (element_type *)0x0) {
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"nullptr","")
                  ;
                }
                else {
                  pcVar3 = (peVar2->super_Object).identifier._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_1f8,pcVar3,
                             pcVar3 + (peVar2->super_Object).identifier._M_string_length);
                }
                plVar11 = (long *)std::__cxx11::string::append((char *)&local_1f8);
                local_240 = &local_230;
                plVar16 = plVar11 + 2;
                if ((long *)*plVar11 == plVar16) {
                  local_230 = *plVar16;
                  lStack_228 = plVar11[3];
                }
                else {
                  local_230 = *plVar16;
                  local_240 = (long *)*plVar11;
                }
                local_238 = plVar11[1];
                *plVar11 = (long)plVar16;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_240);
                if (local_240 != &local_230) {
                  operator_delete(local_240,local_230 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != paVar28) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
                AVar1 = *(AbsoluteDirection *)
                         &((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pMVar22->move_direction)->
                          _M_pi;
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
                ::_Rb_tree(&local_60,&to_absolute_direction_abi_cxx11_._M_t);
                enum_to_str<PSEngine::AbsoluteDirection>
                          ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_240,AVar1,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
                            *)&local_60);
                std::optional<std::__cxx11::string>::value_or<char_const(&)[6]>
                          (&local_218,(optional<std::__cxx11::string> *)&local_240,
                           (char (*) [6])"ERROR");
                plVar11 = (long *)std::__cxx11::string::replace
                                            ((ulong)&local_218,0,(char *)0x0,0x14d1da);
                psVar18 = (size_type *)(plVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar18) {
                  local_1f8.field_2._M_allocated_capacity = *psVar18;
                  local_1f8.field_2._8_8_ = plVar11[3];
                  local_1f8._M_dataplus._M_p = (pointer)paVar28;
                }
                else {
                  local_1f8.field_2._M_allocated_capacity = *psVar18;
                  local_1f8._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_1f8._M_string_length = plVar11[1];
                *plVar11 = (long)psVar18;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                std::__cxx11::string::_M_append
                          ((char *)&local_158,(ulong)local_1f8._M_dataplus._M_p);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != paVar28) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p != &local_218.field_2) {
                  operator_delete(local_218._M_dataplus._M_p,
                                  local_218.field_2._M_allocated_capacity + 1);
                }
                if ((local_220 == '\x01') && (local_220 = '\0', local_240 != &local_230)) {
                  operator_delete(local_240,local_230 + 1);
                }
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
                ::~_Rb_tree(&local_60);
                uVar21 = (pMVar22->origin).x;
                uVar7 = -uVar21;
                if (0 < (int)uVar21) {
                  uVar7 = uVar21;
                }
                uVar26 = 1;
                if (9 < uVar7) {
                  uVar19 = (ulong)uVar7;
                  uVar8 = 4;
                  do {
                    uVar26 = uVar8;
                    uVar10 = (uint)uVar19;
                    if (uVar10 < 100) {
                      uVar26 = uVar26 - 2;
                      goto LAB_00111c9a;
                    }
                    if (uVar10 < 1000) {
                      uVar26 = uVar26 - 1;
                      goto LAB_00111c9a;
                    }
                    if (uVar10 < 10000) goto LAB_00111c9a;
                    uVar19 = uVar19 / 10000;
                    uVar8 = uVar26 + 4;
                  } while (99999 < uVar10);
                  uVar26 = uVar26 + 1;
                }
LAB_00111c9a:
                local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                std::__cxx11::string::_M_construct
                          ((ulong)&local_1d8,(char)uVar26 - (char)((int)uVar21 >> 0x1f));
                std::__detail::__to_chars_10_impl<unsigned_int>
                          (local_1d8._M_dataplus._M_p + (uVar21 >> 0x1f),uVar26,uVar7);
                plVar11 = (long *)std::__cxx11::string::replace
                                            ((ulong)&local_1d8,0,(char *)0x0,0x14d1e1);
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                psVar18 = (size_type *)(plVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar18) {
                  local_218.field_2._M_allocated_capacity = *psVar18;
                  local_218.field_2._8_8_ = plVar11[3];
                }
                else {
                  local_218.field_2._M_allocated_capacity = *psVar18;
                  local_218._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_218._M_string_length = plVar11[1];
                *plVar11 = (long)psVar18;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                plVar11 = (long *)std::__cxx11::string::append((char *)&local_218);
                puVar14 = (ulong *)(plVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar14) {
                  local_1f8.field_2._M_allocated_capacity = *puVar14;
                  local_1f8.field_2._8_8_ = plVar11[3];
                  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
                }
                else {
                  local_1f8.field_2._M_allocated_capacity = *puVar14;
                  local_1f8._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_1f8._M_string_length = plVar11[1];
                *plVar11 = (long)puVar14;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                uVar21 = (pMVar22->origin).y;
                uVar7 = -uVar21;
                if (0 < (int)uVar21) {
                  uVar7 = uVar21;
                }
                uVar26 = 1;
                if (9 < uVar7) {
                  uVar19 = (ulong)uVar7;
                  uVar8 = 4;
                  do {
                    uVar26 = uVar8;
                    uVar10 = (uint)uVar19;
                    if (uVar10 < 100) {
                      uVar26 = uVar26 - 2;
                      goto LAB_00111def;
                    }
                    if (uVar10 < 1000) {
                      uVar26 = uVar26 - 1;
                      goto LAB_00111def;
                    }
                    if (uVar10 < 10000) goto LAB_00111def;
                    uVar19 = uVar19 / 10000;
                    uVar8 = uVar26 + 4;
                  } while (99999 < uVar10);
                  uVar26 = uVar26 + 1;
                }
LAB_00111def:
                local_1b8 = &local_1a8;
                std::__cxx11::string::_M_construct
                          ((ulong)&local_1b8,(char)uVar26 - (char)((int)uVar21 >> 0x1f));
                std::__detail::__to_chars_10_impl<unsigned_int>
                          ((char *)((ulong)(uVar21 >> 0x1f) + (long)local_1b8),uVar26,uVar7);
                uVar24 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  uVar24 = local_1f8.field_2._M_allocated_capacity;
                }
                if ((ulong)uVar24 < local_1b0 + local_1f8._M_string_length) {
                  uVar19 = 0xf;
                  if (local_1b8 != &local_1a8) {
                    uVar19 = local_1a8;
                  }
                  if (uVar19 < local_1b0 + local_1f8._M_string_length) goto LAB_00111e84;
                  puVar12 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_1b8,0,(char *)0x0,
                                       (ulong)local_1f8._M_dataplus._M_p);
                }
                else {
LAB_00111e84:
                  puVar12 = (undefined8 *)
                            std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_1b8);
                }
                local_240 = &local_230;
                plVar11 = puVar12 + 2;
                if ((long *)*puVar12 == plVar11) {
                  local_230 = *plVar11;
                  lStack_228 = puVar12[3];
                }
                else {
                  local_230 = *plVar11;
                  local_240 = (long *)*puVar12;
                }
                local_238 = puVar12[1];
                *puVar12 = plVar11;
                puVar12[1] = 0;
                *(undefined1 *)plVar11 = 0;
                std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_240);
                if (local_240 != &local_230) {
                  operator_delete(local_240,local_230 + 1);
                }
                if (local_1b8 != &local_1a8) {
                  operator_delete(local_1b8,local_1a8 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p != &local_218.field_2) {
                  operator_delete(local_218._M_dataplus._M_p,
                                  local_218.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                  operator_delete(local_1d8._M_dataplus._M_p,
                                  local_1d8.field_2._M_allocated_capacity + 1);
                }
                uVar21 = *(uint *)&(((shared_ptr<CompiledGame::PrimaryObject> *)
                                    &pMVar22->destination)->
                                   super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>
                                   )._M_ptr;
                uVar7 = -uVar21;
                if (0 < (int)uVar21) {
                  uVar7 = uVar21;
                }
                uVar26 = 1;
                if (9 < uVar7) {
                  uVar19 = (ulong)uVar7;
                  uVar8 = 4;
                  do {
                    uVar26 = uVar8;
                    uVar10 = (uint)uVar19;
                    if (uVar10 < 100) {
                      uVar26 = uVar26 - 2;
                      goto LAB_00111fef;
                    }
                    if (uVar10 < 1000) {
                      uVar26 = uVar26 - 1;
                      goto LAB_00111fef;
                    }
                    if (uVar10 < 10000) goto LAB_00111fef;
                    uVar19 = uVar19 / 10000;
                    uVar8 = uVar26 + 4;
                  } while (99999 < uVar10);
                  uVar26 = uVar26 + 1;
                }
LAB_00111fef:
                local_1b8 = &local_1a8;
                std::__cxx11::string::_M_construct
                          ((ulong)&local_1b8,(char)uVar26 - (char)((int)uVar21 >> 0x1f));
                std::__detail::__to_chars_10_impl<unsigned_int>
                          ((char *)((ulong)(uVar21 >> 0x1f) + (long)local_1b8),uVar26,uVar7);
                plVar11 = (long *)std::__cxx11::string::replace
                                            ((ulong)&local_1b8,0,(char *)0x0,0x14d1e9);
                local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                puVar14 = (ulong *)(plVar11 + 2);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*plVar11 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar14) {
                  local_1d8.field_2._M_allocated_capacity = *puVar14;
                  local_1d8.field_2._8_8_ = plVar11[3];
                }
                else {
                  local_1d8.field_2._M_allocated_capacity = *puVar14;
                  local_1d8._M_dataplus._M_p = (pointer)*plVar11;
                }
                local_1d8._M_string_length = plVar11[1];
                *plVar11 = (long)puVar14;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d8);
                local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                puVar14 = puVar12 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar12 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)puVar14) {
                  local_218.field_2._M_allocated_capacity = *puVar14;
                  local_218.field_2._8_8_ = puVar12[3];
                }
                else {
                  local_218.field_2._M_allocated_capacity = *puVar14;
                  local_218._M_dataplus._M_p = (pointer)*puVar12;
                }
                local_218._M_string_length = puVar12[1];
                *puVar12 = puVar14;
                puVar12[1] = 0;
                *(undefined1 *)(puVar12 + 2) = 0;
                uVar21 = *(uint *)((long)&(((shared_ptr<CompiledGame::PrimaryObject> *)
                                           &pMVar22->destination)->
                                          super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>
                                          )._M_ptr + 4);
                uVar7 = -uVar21;
                if (0 < (int)uVar21) {
                  uVar7 = uVar21;
                }
                uVar26 = 1;
                if (9 < uVar7) {
                  uVar19 = (ulong)uVar7;
                  uVar8 = 4;
                  do {
                    uVar26 = uVar8;
                    uVar10 = (uint)uVar19;
                    if (uVar10 < 100) {
                      uVar26 = uVar26 - 2;
                      goto LAB_00112144;
                    }
                    if (uVar10 < 1000) {
                      uVar26 = uVar26 - 1;
                      goto LAB_00112144;
                    }
                    if (uVar10 < 10000) goto LAB_00112144;
                    uVar19 = uVar19 / 10000;
                    uVar8 = uVar26 + 4;
                  } while (99999 < uVar10);
                  uVar26 = uVar26 + 1;
                }
LAB_00112144:
                local_198 = local_188;
                std::__cxx11::string::_M_construct
                          ((ulong)&local_198,(char)uVar26 - (char)((int)uVar21 >> 0x1f));
                std::__detail::__to_chars_10_impl<unsigned_int>
                          ((char *)((long)local_198 + (ulong)(uVar21 >> 0x1f)),uVar26,uVar7);
                uVar24 = 0xf;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p != &local_218.field_2) {
                  uVar24 = local_218.field_2._M_allocated_capacity;
                }
                uVar19 = CONCAT44(uStack_18c,local_190) + local_218._M_string_length;
                if ((ulong)uVar24 < uVar19) {
                  uVar13 = 0xf;
                  if (local_198 != local_188) {
                    uVar13 = local_188[0];
                  }
                  if (uVar13 < uVar19) goto LAB_001121e3;
                  puVar12 = (undefined8 *)
                            std::__cxx11::string::replace
                                      ((ulong)&local_198,0,(char *)0x0,
                                       (ulong)local_218._M_dataplus._M_p);
                }
                else {
LAB_001121e3:
                  puVar12 = (undefined8 *)
                            std::__cxx11::string::_M_append((char *)&local_218,(ulong)local_198);
                }
                psVar18 = puVar12 + 2;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)*puVar12 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)psVar18) {
                  local_1f8.field_2._M_allocated_capacity = *psVar18;
                  local_1f8.field_2._8_8_ = puVar12[3];
                  local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
                }
                else {
                  local_1f8.field_2._M_allocated_capacity = *psVar18;
                  local_1f8._M_dataplus._M_p = (pointer)*puVar12;
                }
                local_1f8._M_string_length = puVar12[1];
                *puVar12 = psVar18;
                puVar12[1] = 0;
                *(undefined1 *)psVar18 = 0;
                plVar11 = (long *)std::__cxx11::string::append((char *)&local_1f8);
                local_240 = &local_230;
                plVar16 = plVar11 + 2;
                if ((long *)*plVar11 == plVar16) {
                  local_230 = *plVar16;
                  lStack_228 = plVar11[3];
                }
                else {
                  local_230 = *plVar16;
                  local_240 = (long *)*plVar11;
                }
                local_238 = plVar11[1];
                *plVar11 = (long)plVar16;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_240);
                if (local_240 != &local_230) {
                  operator_delete(local_240,local_230 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
                if (local_198 != local_188) {
                  operator_delete(local_198,local_188[0] + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p != &local_218.field_2) {
                  operator_delete(local_218._M_dataplus._M_p,
                                  local_218.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                  operator_delete(local_1d8._M_dataplus._M_p,
                                  local_1d8.field_2._M_allocated_capacity + 1);
                }
                if (local_1b8 != &local_1a8) {
                  operator_delete(local_1b8,local_1a8 + 1);
                }
                pMVar22 = pMVar22 + 1;
              } while (pMVar22 != local_118);
            }
          }
          else {
            CompiledGame::Rule::to_string_abi_cxx11_(&local_1f8,&pRVar17->rule_applied,false);
            plVar11 = (long *)std::__cxx11::string::append((char *)&local_1f8);
            local_240 = &local_230;
            plVar16 = plVar11 + 2;
            if ((long *)*plVar11 == plVar16) {
              local_230 = *plVar16;
              lStack_228 = plVar11[3];
            }
            else {
              local_230 = *plVar16;
              local_240 = (long *)*plVar11;
            }
            local_238 = plVar11[1];
            *plVar11 = (long)plVar16;
            plVar11[1] = 0;
            *(undefined1 *)(plVar11 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_240);
            if (local_240 != &local_230) {
              operator_delete(local_240,local_230 + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
              operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1
                             );
            }
            pRVar20 = (local_128->rule_application_deltas).
                      super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_108 = (local_128->rule_application_deltas).
                        super__Vector_base<PSEngine::RuleApplicationDelta,_std::allocator<PSEngine::RuleApplicationDelta>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            if (pRVar20 != local_108) {
              do {
                AVar1 = pRVar20->rule_direction;
                local_120 = pRVar20;
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
                ::_Rb_tree(&local_90,&to_absolute_direction_abi_cxx11_._M_t);
                enum_to_str<PSEngine::AbsoluteDirection>
                          ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&local_240,AVar1,
                           (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
                            *)&local_90);
                std::optional<std::__cxx11::string>::value_or<char_const(&)[6]>
                          (&local_1f8,(optional<std::__cxx11::string> *)&local_240,
                           (char (*) [6])0x14e17d);
                if ((local_220 == '\x01') && (local_220 = '\0', local_240 != &local_230)) {
                  operator_delete(local_240,local_230 + 1);
                }
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_PSEngine::AbsoluteDirection>_>_>
                ::~_Rb_tree(&local_90);
                pPVar4 = (local_120->match_infos).
                         super__Vector_base<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                for (pPVar25 = (local_120->match_infos).
                               super__Vector_base<PSEngine::PatternMatchInformation,_std::allocator<PSEngine::PatternMatchInformation>_>
                               ._M_impl.super__Vector_impl_data._M_start; pPVar25 != pPVar4;
                    pPVar25 = pPVar25 + 1) {
                  uVar21 = (pPVar25->origin).x;
                  uVar7 = -uVar21;
                  if (0 < (int)uVar21) {
                    uVar7 = uVar21;
                  }
                  uVar26 = 1;
                  if (9 < uVar7) {
                    uVar19 = (ulong)uVar7;
                    uVar8 = 4;
                    do {
                      uVar26 = uVar8;
                      uVar10 = (uint)uVar19;
                      if (uVar10 < 100) {
                        uVar26 = uVar26 - 2;
                        goto LAB_00112555;
                      }
                      if (uVar10 < 1000) {
                        uVar26 = uVar26 - 1;
                        goto LAB_00112555;
                      }
                      if (uVar10 < 10000) goto LAB_00112555;
                      uVar19 = uVar19 / 10000;
                      uVar8 = uVar26 + 4;
                    } while (99999 < uVar10);
                    uVar26 = uVar26 + 1;
                  }
LAB_00112555:
                  local_198 = local_188;
                  std::__cxx11::string::_M_construct
                            ((ulong)&local_198,(char)uVar26 - (char)((int)uVar21 >> 0x1f));
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            ((char *)((long)local_198 + (ulong)(uVar21 >> 0x1f)),uVar26,uVar7);
                  plVar11 = (long *)std::__cxx11::string::replace
                                              ((ulong)&local_198,0,(char *)0x0,0x14cdba);
                  local_1b8 = &local_1a8;
                  puVar14 = (ulong *)(plVar11 + 2);
                  if ((ulong *)*plVar11 == puVar14) {
                    local_1a8 = *puVar14;
                    lStack_1a0 = plVar11[3];
                  }
                  else {
                    local_1a8 = *puVar14;
                    local_1b8 = (ulong *)*plVar11;
                  }
                  local_1b0 = plVar11[1];
                  *plVar11 = (long)puVar14;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  plVar11 = (long *)std::__cxx11::string::append((char *)&local_1b8);
                  puVar14 = (ulong *)(plVar11 + 2);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*plVar11 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar14) {
                    local_1d8.field_2._M_allocated_capacity = *puVar14;
                    local_1d8.field_2._8_8_ = plVar11[3];
                    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                  }
                  else {
                    local_1d8.field_2._M_allocated_capacity = *puVar14;
                    local_1d8._M_dataplus._M_p = (pointer)*plVar11;
                  }
                  local_1d8._M_string_length = plVar11[1];
                  *plVar11 = (long)puVar14;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  uVar21 = (pPVar25->origin).y;
                  uVar7 = -uVar21;
                  if (0 < (int)uVar21) {
                    uVar7 = uVar21;
                  }
                  uVar26 = 1;
                  if (9 < uVar7) {
                    uVar19 = (ulong)uVar7;
                    uVar8 = 4;
                    do {
                      uVar26 = uVar8;
                      uVar10 = (uint)uVar19;
                      if (uVar10 < 100) {
                        uVar26 = uVar26 - 2;
                        goto LAB_001126ca;
                      }
                      if (uVar10 < 1000) {
                        uVar26 = uVar26 - 1;
                        goto LAB_001126ca;
                      }
                      if (uVar10 < 10000) goto LAB_001126ca;
                      uVar19 = uVar19 / 10000;
                      uVar8 = uVar26 + 4;
                    } while (99999 < uVar10);
                    uVar26 = uVar26 + 1;
                  }
LAB_001126ca:
                  local_178 = local_168;
                  std::__cxx11::string::_M_construct
                            ((ulong)&local_178,(char)uVar26 - (char)((int)uVar21 >> 0x1f));
                  std::__detail::__to_chars_10_impl<unsigned_int>
                            ((char *)((ulong)(uVar21 >> 0x1f) + (long)local_178),uVar26,uVar7);
                  uVar24 = 0xf;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                    uVar24 = local_1d8.field_2._M_allocated_capacity;
                  }
                  if ((ulong)uVar24 < local_170 + local_1d8._M_string_length) {
                    uVar19 = 0xf;
                    if (local_178 != local_168) {
                      uVar19 = local_168[0];
                    }
                    if (uVar19 < local_170 + local_1d8._M_string_length) goto LAB_00112767;
                    puVar12 = (undefined8 *)
                              std::__cxx11::string::replace
                                        ((ulong)&local_178,0,(char *)0x0,
                                         (ulong)local_1d8._M_dataplus._M_p);
                  }
                  else {
LAB_00112767:
                    puVar12 = (undefined8 *)
                              std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_178);
                  }
                  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                  puVar14 = puVar12 + 2;
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)*puVar12 ==
                      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)puVar14) {
                    local_218.field_2._M_allocated_capacity = *puVar14;
                    local_218.field_2._8_8_ = puVar12[3];
                  }
                  else {
                    local_218.field_2._M_allocated_capacity = *puVar14;
                    local_218._M_dataplus._M_p = (pointer)*puVar12;
                  }
                  local_218._M_string_length = puVar12[1];
                  *puVar12 = puVar14;
                  puVar12[1] = 0;
                  *(undefined1 *)puVar14 = 0;
                  plVar11 = (long *)std::__cxx11::string::append((char *)&local_218);
                  local_240 = &local_230;
                  plVar16 = plVar11 + 2;
                  if ((long *)*plVar11 == plVar16) {
                    local_230 = *plVar16;
                    lStack_228 = plVar11[3];
                  }
                  else {
                    local_230 = *plVar16;
                    local_240 = (long *)*plVar11;
                  }
                  local_238 = plVar11[1];
                  *plVar11 = (long)plVar16;
                  plVar11[1] = 0;
                  *(undefined1 *)(plVar11 + 2) = 0;
                  std::__cxx11::string::_M_append((char *)&local_1f8,(ulong)local_240);
                  if (local_240 != &local_230) {
                    operator_delete(local_240,local_230 + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_218._M_dataplus._M_p != &local_218.field_2) {
                    operator_delete(local_218._M_dataplus._M_p,
                                    local_218.field_2._M_allocated_capacity + 1);
                  }
                  if (local_178 != local_168) {
                    operator_delete(local_178,local_168[0] + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
                    operator_delete(local_1d8._M_dataplus._M_p,
                                    local_1d8.field_2._M_allocated_capacity + 1);
                  }
                  if (local_1b8 != &local_1a8) {
                    operator_delete(local_1b8,local_1a8 + 1);
                  }
                  if (local_198 != local_188) {
                    operator_delete(local_198,local_188[0] + 1);
                  }
                }
                std::operator+(&local_218,"\t",&local_1f8);
                plVar11 = (long *)std::__cxx11::string::append((char *)&local_218);
                local_240 = &local_230;
                plVar16 = plVar11 + 2;
                if ((long *)*plVar11 == plVar16) {
                  local_230 = *plVar16;
                  lStack_228 = plVar11[3];
                }
                else {
                  local_230 = *plVar16;
                  local_240 = (long *)*plVar11;
                }
                local_238 = plVar11[1];
                *plVar11 = (long)plVar16;
                plVar11[1] = 0;
                *(undefined1 *)(plVar11 + 2) = 0;
                std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_240);
                if (local_240 != &local_230) {
                  operator_delete(local_240,local_230 + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._M_dataplus._M_p != &local_218.field_2) {
                  operator_delete(local_218._M_dataplus._M_p,
                                  local_218.field_2._M_allocated_capacity + 1);
                }
                pMVar22 = (pointer)(local_120->object_deltas).
                                   super__Vector_base<PSEngine::ObjectDelta,_std::allocator<PSEngine::ObjectDelta>_>
                                   ._M_impl.super__Vector_impl_data._M_start;
                local_118 = (pointer)(local_120->object_deltas).
                                     super__Vector_base<PSEngine::ObjectDelta,_std::allocator<PSEngine::ObjectDelta>_>
                                     ._M_impl.super__Vector_impl_data._M_finish;
                if (pMVar22 != local_118) {
                  do {
                    uVar21 = (pMVar22->origin).x;
                    uVar7 = -uVar21;
                    if (0 < (int)uVar21) {
                      uVar7 = uVar21;
                    }
                    uVar26 = 1;
                    if (9 < uVar7) {
                      uVar19 = (ulong)uVar7;
                      uVar8 = 4;
                      do {
                        uVar26 = uVar8;
                        uVar10 = (uint)uVar19;
                        if (uVar10 < 100) {
                          uVar26 = uVar26 - 2;
                          goto LAB_00112a48;
                        }
                        if (uVar10 < 1000) {
                          uVar26 = uVar26 - 1;
                          goto LAB_00112a48;
                        }
                        if (uVar10 < 10000) goto LAB_00112a48;
                        uVar19 = uVar19 / 10000;
                        uVar8 = uVar26 + 4;
                      } while (99999 < uVar10);
                      uVar26 = uVar26 + 1;
                    }
LAB_00112a48:
                    local_198 = local_188;
                    std::__cxx11::string::_M_construct
                              ((ulong)&local_198,(char)uVar26 - (char)((int)uVar21 >> 0x1f));
                    std::__detail::__to_chars_10_impl<unsigned_int>
                              ((char *)((long)local_198 + (ulong)(uVar21 >> 0x1f)),uVar26,uVar7);
                    plVar11 = (long *)std::__cxx11::string::replace
                                                ((ulong)&local_198,0,(char *)0x0,0x14d1f6);
                    local_1b8 = &local_1a8;
                    puVar14 = (ulong *)(plVar11 + 2);
                    if ((ulong *)*plVar11 == puVar14) {
                      local_1a8 = *puVar14;
                      lStack_1a0 = plVar11[3];
                    }
                    else {
                      local_1a8 = *puVar14;
                      local_1b8 = (ulong *)*plVar11;
                    }
                    local_1b0 = plVar11[1];
                    *plVar11 = (long)puVar14;
                    plVar11[1] = 0;
                    *(undefined1 *)(plVar11 + 2) = 0;
                    plVar11 = (long *)std::__cxx11::string::append((char *)&local_1b8);
                    puVar14 = (ulong *)(plVar11 + 2);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*plVar11 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)puVar14) {
                      local_1d8.field_2._M_allocated_capacity = *puVar14;
                      local_1d8.field_2._8_8_ = plVar11[3];
                      local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
                    }
                    else {
                      local_1d8.field_2._M_allocated_capacity = *puVar14;
                      local_1d8._M_dataplus._M_p = (pointer)*plVar11;
                    }
                    local_1d8._M_string_length = plVar11[1];
                    *plVar11 = (long)puVar14;
                    plVar11[1] = 0;
                    *(undefined1 *)(plVar11 + 2) = 0;
                    uVar21 = (pMVar22->origin).y;
                    uVar7 = -uVar21;
                    if (0 < (int)uVar21) {
                      uVar7 = uVar21;
                    }
                    uVar26 = 1;
                    if (9 < uVar7) {
                      uVar19 = (ulong)uVar7;
                      uVar8 = 4;
                      do {
                        uVar26 = uVar8;
                        uVar10 = (uint)uVar19;
                        if (uVar10 < 100) {
                          uVar26 = uVar26 - 2;
                          goto LAB_00112bc1;
                        }
                        if (uVar10 < 1000) {
                          uVar26 = uVar26 - 1;
                          goto LAB_00112bc1;
                        }
                        if (uVar10 < 10000) goto LAB_00112bc1;
                        uVar19 = uVar19 / 10000;
                        uVar8 = uVar26 + 4;
                      } while (99999 < uVar10);
                      uVar26 = uVar26 + 1;
                    }
LAB_00112bc1:
                    local_178 = local_168;
                    std::__cxx11::string::_M_construct
                              ((ulong)&local_178,(char)uVar26 - (char)((int)uVar21 >> 0x1f));
                    std::__detail::__to_chars_10_impl<unsigned_int>
                              ((char *)((ulong)(uVar21 >> 0x1f) + (long)local_178),uVar26,uVar7);
                    paVar28 = &local_1d8.field_2;
                    uVar24 = 0xf;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1d8._M_dataplus._M_p != paVar28) {
                      uVar24 = local_1d8.field_2._M_allocated_capacity;
                    }
                    if ((ulong)uVar24 < local_170 + local_1d8._M_string_length) {
                      uVar19 = 0xf;
                      if (local_178 != local_168) {
                        uVar19 = local_168[0];
                      }
                      if (uVar19 < local_170 + local_1d8._M_string_length) goto LAB_00112c5e;
                      puVar12 = (undefined8 *)
                                std::__cxx11::string::replace
                                          ((ulong)&local_178,0,(char *)0x0,
                                           (ulong)local_1d8._M_dataplus._M_p);
                    }
                    else {
LAB_00112c5e:
                      puVar12 = (undefined8 *)
                                std::__cxx11::string::_M_append((char *)&local_1d8,(ulong)local_178)
                      ;
                    }
                    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                    psVar18 = puVar12 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar12 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)psVar18) {
                      local_218.field_2._M_allocated_capacity = *psVar18;
                      local_218.field_2._8_8_ = puVar12[3];
                    }
                    else {
                      local_218.field_2._M_allocated_capacity = *psVar18;
                      local_218._M_dataplus._M_p = (pointer)*puVar12;
                    }
                    local_218._M_string_length = puVar12[1];
                    *puVar12 = psVar18;
                    puVar12[1] = 0;
                    *(undefined1 *)psVar18 = 0;
                    plVar11 = (long *)std::__cxx11::string::append((char *)&local_218);
                    local_240 = &local_230;
                    plVar16 = plVar11 + 2;
                    if ((long *)*plVar11 == plVar16) {
                      local_230 = *plVar16;
                      lStack_228 = plVar11[3];
                    }
                    else {
                      local_230 = *plVar16;
                      local_240 = (long *)*plVar11;
                    }
                    local_238 = plVar11[1];
                    *plVar11 = (long)plVar16;
                    plVar11[1] = 0;
                    *(undefined1 *)(plVar11 + 2) = 0;
                    std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_240);
                    if (local_240 != &local_230) {
                      operator_delete(local_240,local_230 + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_218._M_dataplus._M_p != &local_218.field_2) {
                      operator_delete(local_218._M_dataplus._M_p,
                                      local_218.field_2._M_allocated_capacity + 1);
                    }
                    if (local_178 != local_168) {
                      operator_delete(local_178,local_168[0] + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1d8._M_dataplus._M_p != paVar28) {
                      operator_delete(local_1d8._M_dataplus._M_p,
                                      local_1d8.field_2._M_allocated_capacity + 1);
                    }
                    if (local_1b8 != &local_1a8) {
                      operator_delete(local_1b8,local_1a8 + 1);
                    }
                    if (local_198 != local_188) {
                      operator_delete(local_198,local_188[0] + 1);
                    }
                    peVar2 = (((shared_ptr<CompiledGame::PrimaryObject> *)&pMVar22->destination)->
                             super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>
                             )._M_ptr;
                    if (peVar2 == (element_type *)0x0) {
                      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_218,"nullptr","");
                    }
                    else {
                      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                      pcVar3 = (peVar2->super_Object).identifier._M_dataplus._M_p;
                      std::__cxx11::string::_M_construct<char*>
                                ((string *)&local_218,pcVar3,
                                 pcVar3 + (peVar2->super_Object).identifier._M_string_length);
                    }
                    plVar11 = (long *)std::__cxx11::string::append((char *)&local_218);
                    local_240 = &local_230;
                    plVar16 = plVar11 + 2;
                    if ((long *)*plVar11 == plVar16) {
                      local_230 = *plVar16;
                      lStack_228 = plVar11[3];
                    }
                    else {
                      local_230 = *plVar16;
                      local_240 = (long *)*plVar11;
                    }
                    local_238 = plVar11[1];
                    *plVar11 = (long)plVar16;
                    plVar11[1] = 0;
                    *(undefined1 *)(plVar11 + 2) = 0;
                    std::__cxx11::string::_M_append((char *)&local_158,(ulong)local_240);
                    if (local_240 != &local_230) {
                      operator_delete(local_240,local_230 + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_218._M_dataplus._M_p != &local_218.field_2) {
                      operator_delete(local_218._M_dataplus._M_p,
                                      local_218.field_2._M_allocated_capacity + 1);
                    }
                    p_enum_value = *(ObjectDeltaType *)
                                    &(pMVar22->object).
                                     super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr;
                    std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>_>_>
                    ::_Rb_tree(&local_c0,&CompiledGame::to_object_delta_type_abi_cxx11_._M_t);
                    enum_to_str<CompiledGame::ObjectDeltaType>
                              ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                *)&local_240,p_enum_value,
                               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>_>_>
                                *)&local_c0);
                    std::optional<std::__cxx11::string>::value_or<char_const(&)[6]>
                              (&local_1d8,(optional<std::__cxx11::string> *)&local_240,
                               (char (*) [6])"ERROR");
                    puVar12 = (undefined8 *)std::__cxx11::string::append((char *)&local_1d8);
                    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
                    puVar14 = puVar12 + 2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)*puVar12 ==
                        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)puVar14) {
                      local_218.field_2._M_allocated_capacity = *puVar14;
                      local_218.field_2._8_8_ = puVar12[3];
                    }
                    else {
                      local_218.field_2._M_allocated_capacity = *puVar14;
                      local_218._M_dataplus._M_p = (pointer)*puVar12;
                    }
                    local_218._M_string_length = puVar12[1];
                    *puVar12 = puVar14;
                    puVar12[1] = 0;
                    *(undefined1 *)(puVar12 + 2) = 0;
                    std::__cxx11::string::_M_append
                              ((char *)&local_158,(ulong)local_218._M_dataplus._M_p);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_218._M_dataplus._M_p != &local_218.field_2) {
                      operator_delete(local_218._M_dataplus._M_p,
                                      local_218.field_2._M_allocated_capacity + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_1d8._M_dataplus._M_p != paVar28) {
                      operator_delete(local_1d8._M_dataplus._M_p,
                                      local_1d8.field_2._M_allocated_capacity + 1);
                    }
                    if ((local_220 == '\x01') && (local_220 = '\0', local_240 != &local_230)) {
                      operator_delete(local_240,local_230 + 1);
                    }
                    std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>_>,_ci_less,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CompiledGame::ObjectDeltaType>_>_>
                    ::~_Rb_tree(&local_c0);
                    pMVar22 = (pointer)&(pMVar22->object).
                                        super___shared_ptr<CompiledGame::PrimaryObject,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount;
                  } while (pMVar22 != local_118);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
                  operator_delete(local_1f8._M_dataplus._M_p,
                                  local_1f8.field_2._M_allocated_capacity + 1);
                }
                pRVar20 = local_120 + 1;
              } while (pRVar20 != local_108);
            }
          }
          pRVar17 = local_128 + 1;
        } while (pRVar17 != local_110);
      }
      pSVar27 = (local_138->m_turn_history).subturns.
                super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>
                ._M_impl.super__Vector_impl_data._M_start;
      uVar13 = ((long)(local_138->m_turn_history).subturns.
                      super__Vector_base<PSEngine::SubturnHistory,_std::allocator<PSEngine::SubturnHistory>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar27 >> 3) *
               -0x5555555555555555;
      uVar19 = local_130;
    } while (local_130 <= uVar13 && uVar13 - local_130 != 0);
  }
  if ((int)(local_138->m_config).log_verbosity < 3) {
    peVar5 = (local_138->m_logger).super___shared_ptr<PSLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_e0[0] = local_d0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_e0,m_engine_log_cat_abi_cxx11_._M_dataplus._M_p,
               m_engine_log_cat_abi_cxx11_._M_dataplus._M_p +
               m_engine_log_cat_abi_cxx11_._M_string_length);
    local_100[0] = local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_100,local_158,local_150 + (long)local_158);
    (*peVar5->_vptr_PSLogger[2])(peVar5,2,local_e0,local_100);
    if (local_100[0] != local_f0) {
      operator_delete(local_100[0],local_f0[0] + 1);
    }
    if (local_e0[0] != local_d0) {
      operator_delete(local_e0[0],local_d0[0] + 1);
    }
  }
  if (local_158 != local_148) {
    operator_delete(local_158,local_148[0] + 1);
  }
  return;
}

Assistant:

void PSEngine::print_subturns_history() const
{
    string result = "";
    for(int i = 0; i < m_turn_history.subturns.size(); ++i)
    {
        const auto& subturn = m_turn_history.subturns[i];
        result += "--- Subturn " + to_string(i+1) + "/" + to_string(m_turn_history.subturns.size()) + "---\n";
        for(const auto& rule_delta : subturn.steps)
        {
            if(rule_delta.is_movement_resolution)
            {
                result += "Movement Resolution\n";
                for(const auto& move_delta : rule_delta.movement_deltas)
                {
                    result += "\t";
                    result += (move_delta.object.get() != nullptr ? move_delta.object->identifier : "nullptr") + " ";
                    result += "moved " + enum_to_str(move_delta.move_direction,to_absolute_direction).value_or("ERROR");
                    result += " from ("+ to_string(move_delta.origin.x)+","+to_string(move_delta.origin.y);
                    result += ") to ("+to_string(move_delta.destination.x)+","+to_string(move_delta.destination.y)+")\n";
                }
            }
            else
            {
                result += rule_delta.rule_applied.to_string()+"\n";
                for(const auto& rule_app_delta : rule_delta.rule_application_deltas)
                {
                    string rule_match_str = enum_to_str(rule_app_delta.rule_direction, to_absolute_direction).value_or("error");
                    for(const auto& m : rule_app_delta.match_infos)
                    {
                        rule_match_str += " ("+to_string(m.origin.x)+","+to_string(m.origin.y)+") ";
                    }

                    result += "\t" + rule_match_str + "\n";
                    for(const auto& object_delta : rule_app_delta.object_deltas)
                    {
                        result += "\t\t" + to_string(object_delta.cell_position.x)+","+to_string(object_delta.cell_position.y)+" ";
                        result += (object_delta.object.get() != nullptr ? object_delta.object->identifier : "nullptr") + " ";
                        result += enum_to_str(object_delta.type,CompiledGame::to_object_delta_type).value_or("ERROR") + "\n";
                    }
                }
            }
        }
    }

    PS_LOG(result);
}